

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::RenderDeviceVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator=
          (RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *this,RenderDeviceVkImpl *pObj)

{
  RenderDeviceVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (RenderDeviceVkImpl *)0x0) {
      RenderDeviceBase<Diligent::EngineVkImplTraits>::Release
                ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (RenderDeviceVkImpl *)0x0) {
      RefCountedObject<Diligent::IRenderDeviceVk>::AddRef
                ((RefCountedObject<Diligent::IRenderDeviceVk> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }